

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::PrimitiveRestartForPatchesSupportedCase::iterate
          (PrimitiveRestartForPatchesSupportedCase *this)

{
  TestLog *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  bool *pbVar4;
  ScopedLogSection subsection;
  QueriedState state;
  CallLogWrapper gl;
  ResultCollector result;
  ScopedLogSection local_f8;
  undefined1 local_f0 [40];
  CallLogWrapper local_c8;
  string local_b0;
  string local_90;
  ResultCollector local_70;
  
  checkTessellationSupport((this->super_TestCase).m_context);
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_c8,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_f0._0_8_ = local_f0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_70,pTVar1,(string *)local_f0);
  if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  deqp::gls::StateQueryUtil::QueriedState::QueriedState((QueriedState *)local_f0);
  local_c8.m_enableLog = true;
  deqp::gls::StateQueryUtil::queryState
            (&local_70,&local_c8,QUERY_BOOLEAN,0x8221,(QueriedState *)local_f0);
  bVar2 = deqp::gls::StateQueryUtil::QueriedState::isUndefined((QueriedState *)local_f0);
  if (!bVar2) {
    pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Types","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Alternative types","");
    tcu::ScopedLogSection::ScopedLogSection(&local_f8,pTVar1,&local_90,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    pbVar4 = deqp::gls::StateQueryUtil::QueriedState::getBoolAccess((QueriedState *)local_f0);
    deqp::gls::StateQueryUtil::verifyStateBoolean(&local_70,&local_c8,0x8221,*pbVar4,QUERY_INTEGER);
    pbVar4 = deqp::gls::StateQueryUtil::QueriedState::getBoolAccess((QueriedState *)local_f0);
    deqp::gls::StateQueryUtil::verifyStateBoolean
              (&local_70,&local_c8,0x8221,*pbVar4,QUERY_INTEGER64);
    pbVar4 = deqp::gls::StateQueryUtil::QueriedState::getBoolAccess((QueriedState *)local_f0);
    deqp::gls::StateQueryUtil::verifyStateBoolean(&local_70,&local_c8,0x8221,*pbVar4,QUERY_FLOAT);
    tcu::TestLog::endSection(local_f8.m_log);
  }
  tcu::ResultCollector::setTestContextResult
            (&local_70,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_message._M_dataplus._M_p != &local_70.m_message.field_2) {
    operator_delete(local_70.m_message._M_dataplus._M_p,
                    local_70.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_prefix._M_dataplus._M_p != &local_70.m_prefix.field_2) {
    operator_delete(local_70.m_prefix._M_dataplus._M_p,
                    local_70.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_c8);
  return STOP;
}

Assistant:

PrimitiveRestartForPatchesSupportedCase::IterateResult PrimitiveRestartForPatchesSupportedCase::iterate (void)
{
	checkTessellationSupport(m_context);

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	QueriedState			state;

	gl.enableLogging(true);

	queryState(result, gl, QUERY_BOOLEAN, GL_PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED, state);

	if (!state.isUndefined())
	{
		const tcu::ScopedLogSection	subsection(m_testCtx.getLog(), "Types", "Alternative types");
		verifyStateBoolean(result, gl, GL_PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED, state.getBoolAccess(), QUERY_INTEGER);
		verifyStateBoolean(result, gl, GL_PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED, state.getBoolAccess(), QUERY_INTEGER64);
		verifyStateBoolean(result, gl, GL_PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED, state.getBoolAccess(), QUERY_FLOAT);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}